

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O0

int __thiscall TadsServerManager::rand(TadsServerManager *this)

{
  uint32_t uVar1;
  ulong r;
  uint32_t local_1c;
  
  OS_Mutex::lock((OS_Mutex *)0x25e00c);
  uVar1 = this->ic->cnt;
  this->ic->cnt = uVar1 - 1;
  if (uVar1 == 0) {
    isaac_gen_group(this->ic);
    this->ic->cnt = 0xff;
    local_1c = this->ic->rsl[this->ic->cnt];
  }
  else {
    local_1c = this->ic->rsl[this->ic->cnt];
  }
  OS_Mutex::unlock((OS_Mutex *)0x25e084);
  return local_1c;
}

Assistant:

ulong TadsServerManager::rand()
{
    /* ISAAC needs protection against multi-threaded access */
    mutex->lock();

    /* get a random number */
    ulong r = isaac_rand(ic);

    /* done with the mutex */
    mutex->unlock();

    /* return the number */
    return r;
}